

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_isCompatibleBothUnitsImported_Test::~Units_isCompatibleBothUnitsImported_Test
          (Units_isCompatibleBothUnitsImported_Test *this)

{
  Units_isCompatibleBothUnitsImported_Test *this_local;
  
  ~Units_isCompatibleBothUnitsImported_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, isCompatibleBothUnitsImported)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");

    u1->setImportSource(import);
    u2->setImportSource(import);

    EXPECT_TRUE(u1->isImport());
    EXPECT_FALSE(libcellml::Units::compatible(u1, u2));
    EXPECT_FALSE(libcellml::Units::compatible(u2, u1));
}